

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O0

void ut11::Assert::That<char[16],ut11::detail::NotOperand<ut11::Operands::IsStringEndingWith>>
               (size_t line,string *file,char (*expected) [16],
               NotOperand<ut11::Operands::IsStringEndingWith> *operand)

{
  string *line_00;
  bool bVar1;
  NotOperand<ut11::Operands::IsStringEndingWith> local_68;
  string local_48 [32];
  NotOperand<ut11::Operands::IsStringEndingWith> *local_28;
  NotOperand<ut11::Operands::IsStringEndingWith> *operand_local;
  char (*expected_local) [16];
  string *file_local;
  size_t line_local;
  
  local_28 = operand;
  operand_local = (NotOperand<ut11::Operands::IsStringEndingWith> *)expected;
  expected_local = (char (*) [16])file;
  file_local = (string *)line;
  bVar1 = detail::NotOperand<ut11::Operands::IsStringEndingWith>::operator()(operand,expected);
  line_00 = file_local;
  if (!bVar1) {
    std::__cxx11::string::string(local_48,(string *)file);
    detail::NotOperand<ut11::Operands::IsStringEndingWith>::GetErrorMessage<char[16]>
              (&local_68,(char (*) [16])local_28);
    Fail((size_t)line_00,(string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}